

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

char * __thiscall IrSim::print2(IrSim *this,C_IC *i)

{
  size_t __maxlen;
  char *__format;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  char *pcVar3;
  string local_90;
  string local_70;
  string local_50;
  
  if ((i->arg1).kind == 0) {
    pcVar3 = print1(this,i);
    return pcVar3;
  }
  __maxlen = this->PBSIZE;
  pcVar3 = this->pb;
  if ((long)i->kind == 2) {
    Operand::str_abi_cxx11_(&local_70,&i->target);
    _Var2._M_p = local_70._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_90,&OP_ZERO);
    _Var1._M_p = local_90._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_50,&i->arg1);
    snprintf(pcVar3,__maxlen,"%s := %s - %s\n",_Var2._M_p,_Var1._M_p,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00109aea;
  }
  else {
    __format = icFmt[i->kind];
    Operand::str_abi_cxx11_(&local_70,&i->target);
    _Var1._M_p = local_70._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_90,&i->arg1);
    snprintf(pcVar3,__maxlen,__format,_Var1._M_p,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00109aea;
  }
  operator_delete(local_90._M_dataplus._M_p);
LAB_00109aea:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return this->pb;
}

Assistant:

const char *IrSim::print2(C_IC &i) const {
    if (i.arg1.kind == IR_NONE) return print1(i);
    if (i.kind == IC_SUB)
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), OP_ZERO.str().c_str(), i[1].str().c_str());
    else
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), i[1].str().c_str());
    return pb;
}